

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O2

void ImPlot::PlotPieChart<double>
               (char **label_ids,double *values,int count,double x,double y,double radius,
               bool normalize,char *fmt,double angle0)

{
  double dVar1;
  ImVec2 IVar2;
  ImVec2 IVar3;
  double dVar4;
  ImVec4 IVar5;
  bool bVar6;
  ImU32 IVar7;
  ImDrawList *this;
  ImPlotItem *pIVar8;
  ulong uVar9;
  int i;
  int i_1;
  ulong uVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  float local_d8;
  float fStack_d4;
  float local_a8;
  float fStack_a4;
  ImPlotPoint center;
  ImVec4 local_68;
  char buffer [32];
  
  if (GImPlot->CurrentPlot == (ImPlotPlot *)0x0) {
    __assert_fail("(GImPlot->CurrentPlot != __null) && \"PlotPieChart() needs to be called between BeginPlot() and EndPlot()!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/implot_items.cpp"
                  ,0x6b2,
                  "void ImPlot::PlotPieChart(const char *const *, const T *, int, double, double, double, bool, const char *, double) [T = double]"
                 );
  }
  this = GetPlotDrawList();
  uVar9 = 0;
  uVar10 = (ulong)(uint)count;
  if (count < 1) {
    uVar10 = uVar9;
  }
  dVar1 = 0.0;
  for (; uVar10 != uVar9; uVar9 = uVar9 + 1) {
    dVar1 = dVar1 + values[uVar9];
  }
  center.x = x;
  center.y = y;
  PushPlotClipRect(0.0);
  dVar11 = ((angle0 + angle0) * 3.1415927410125732) / 360.0;
  dVar14 = dVar11;
  for (uVar9 = 0; uVar10 != uVar9; uVar9 = uVar9 + 1) {
    dVar13 = values[uVar9];
    if (normalize || 1.0 < dVar1) {
      dVar13 = dVar13 / dVar1;
    }
    dVar12 = dVar13 * 6.2831854820251465 + dVar14;
    bVar6 = BeginItem(label_ids[uVar9],-1);
    if (bVar6) {
      IVar7 = GImPlot->CurrentItem->Color;
      if (0.5 <= dVar13) {
        dVar13 = (dVar12 - dVar14) * 0.5 + dVar14;
        RenderPieSlice(this,&center,radius,dVar14,dVar13,IVar7);
        dVar14 = dVar13;
      }
      RenderPieSlice(this,&center,radius,dVar14,dVar12,IVar7);
      EndItem();
    }
    dVar14 = dVar12;
  }
  if (fmt != (char *)0x0) {
    for (uVar9 = 0; uVar10 != uVar9; uVar9 = uVar9 + 1) {
      pIVar8 = GetItem(label_ids[uVar9]);
      dVar14 = values[uVar9];
      if (normalize || 1.0 < dVar1) {
        dVar14 = dVar14 / dVar1;
      }
      dVar14 = dVar14 * 6.2831854820251465 + dVar11;
      if (pIVar8->Show == true) {
        sprintf(buffer,fmt);
        IVar2 = ImGui::CalcTextSize(buffer,(char *)0x0,false,-1.0);
        dVar12 = center.x;
        dVar11 = (dVar14 - dVar11) * 0.5 + dVar11;
        dVar13 = cos(dVar11);
        dVar4 = center.y;
        dVar11 = sin(dVar11);
        IVar3 = PlotToPixels(dVar13 * radius * 0.5 + dVar12,dVar4 + dVar11 * radius * 0.5,-1);
        local_68 = ImGui::ColorConvertU32ToFloat4(pIVar8->Color);
        IVar7 = CalcTextColor(&local_68);
        IVar5 = local_68;
        local_a8 = IVar2.x;
        fStack_a4 = IVar2.y;
        local_d8 = IVar3.x;
        fStack_d4 = IVar3.y;
        local_68.y = fStack_a4 * -0.5 + fStack_d4;
        local_68.x = local_a8 * -0.5 + local_d8;
        local_68._8_8_ = IVar5._8_8_;
        ImDrawList::AddText(this,(ImVec2 *)&local_68,IVar7,buffer,(char *)0x0);
      }
      dVar11 = dVar14;
    }
  }
  PopPlotClipRect();
  return;
}

Assistant:

void PlotPieChart(const char* const label_ids[], const T* values, int count, double x, double y, double radius, bool normalize, const char* fmt, double angle0) {
    IM_ASSERT_USER_ERROR(GImPlot->CurrentPlot != NULL, "PlotPieChart() needs to be called between BeginPlot() and EndPlot()!");
    ImDrawList & DrawList = *GetPlotDrawList();
    double sum = 0;
    for (int i = 0; i < count; ++i)
        sum += (double)values[i];
    normalize = normalize || sum > 1.0;
    ImPlotPoint center(x,y);
    PushPlotClipRect();
    double a0 = angle0 * 2 * IM_PI / 360.0;
    double a1 = angle0 * 2 * IM_PI / 360.0;
    for (int i = 0; i < count; ++i) {
        double percent = normalize ? (double)values[i] / sum : (double)values[i];
        a1 = a0 + 2 * IM_PI * percent;
        if (BeginItem(label_ids[i])) {
            ImU32 col = GetCurrentItem()->Color;
            if (percent < 0.5) {
                RenderPieSlice(DrawList, center, radius, a0, a1, col);
            }
            else  {
                RenderPieSlice(DrawList, center, radius, a0, a0 + (a1 - a0) * 0.5, col);
                RenderPieSlice(DrawList, center, radius, a0 + (a1 - a0) * 0.5, a1, col);
            }
            EndItem();
        }
        a0 = a1;
    }
    if (fmt != NULL) {
        a0 = angle0 * 2 * IM_PI / 360.0;
        a1 = angle0 * 2 * IM_PI / 360.0;
        char buffer[32];
        for (int i = 0; i < count; ++i) {
            ImPlotItem* item = GetItem(label_ids[i]);
            double percent = normalize ? (double)values[i] / sum : (double)values[i];
            a1 = a0 + 2 * IM_PI * percent;
            if (item->Show) {
                sprintf(buffer, fmt, (double)values[i]);
                ImVec2 size = ImGui::CalcTextSize(buffer);
                double angle = a0 + (a1 - a0) * 0.5;
                ImVec2 pos = PlotToPixels(center.x + 0.5 * radius * cos(angle), center.y + 0.5 * radius * sin(angle));
                ImU32 col  = CalcTextColor(ImGui::ColorConvertU32ToFloat4(item->Color));
                DrawList.AddText(pos - size * 0.5f, col, buffer);
            }
            a0 = a1;
        }
    }
    PopPlotClipRect();
}